

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::requireInt8Arithmetic
          (TParseVersions *this,TSourceLoc *loc,char *op,char *featureDesc)

{
  char *pcVar1;
  char *local_68;
  char *extensions [2];
  undefined1 local_50 [8];
  TString combined;
  char *featureDesc_local;
  char *op_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  combined.field_2._8_8_ = featureDesc;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50,
            op);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50,
             ": ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50,
             (char *)combined.field_2._8_8_);
  local_68 = "GL_EXT_shader_explicit_arithmetic_types";
  extensions[0] = "GL_EXT_shader_explicit_arithmetic_types_int8";
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_50);
  (*this->_vptr_TParseVersions[5])(this,loc,2,&local_68,pcVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_50);
  return;
}

Assistant:

void TParseVersions::requireInt8Arithmetic(const TSourceLoc& loc, const char* op, const char* featureDesc)
{
    TString combined;
    combined = op;
    combined += ": ";
    combined += featureDesc;

    const char* const extensions[] = {
                                       E_GL_EXT_shader_explicit_arithmetic_types,
                                       E_GL_EXT_shader_explicit_arithmetic_types_int8};
    requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, combined.c_str());
}